

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Scope::~Scope(Scope *this)

{
  Element *this_00;
  bool bVar1;
  reference ppVar2;
  value_type *v;
  iterator __end2;
  iterator __begin2;
  ElementMap *__range2;
  Scope *this_local;
  
  __end2 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::begin(&this->elements);
  v = (value_type *)
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
      ::end(&this->elements);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&v);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
             ::operator*(&__end2);
    this_00 = ppVar2->second;
    if (this_00 != (Element *)0x0) {
      Element::~Element(this_00);
      operator_delete(this_00,0x28);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
    ::operator++(&__end2);
  }
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  ::~multimap(&this->elements);
  return;
}

Assistant:

Scope::~Scope()
{
    for(ElementMap::value_type& v : elements) {
        delete v.second;
    }
}